

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O0

int __thiscall QTzTimeZonePrivate::offsetFromUtc(QTzTimeZonePrivate *this,qint64 atMSecsSinceEpoch)

{
  long lVar1;
  long in_FS_OFFSET;
  Data tran;
  qint64 in_stack_00000080;
  QTzTimeZonePrivate *in_stack_00000088;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  data(in_stack_00000088,in_stack_00000080);
  QTimeZonePrivate::Data::~Data((Data *)0x74d3bf);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return -0x55555556;
  }
  __stack_chk_fail();
}

Assistant:

int QTzTimeZonePrivate::offsetFromUtc(qint64 atMSecsSinceEpoch) const
{
    const Data tran = data(atMSecsSinceEpoch);
    return tran.offsetFromUtc; // == tran.standardTimeOffset + tran.daylightTimeOffset
}